

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_value_constructor_forward_list_Test::TestBody
          (ObjectTest_basic_value_constructor_forward_list_Test *this)

{
  _Fwd_list_node_base _Var1;
  _Fwd_list_node_base *p_Var2;
  undefined8 *puVar3;
  _Fwd_list_impl _Var4;
  _Uninitialized<void_*,_true> _Var5;
  pointer *__ptr;
  char *pcVar6;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  object test_object__;
  _Fwd_list_impl local_98;
  _Fwd_list_impl local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)&local_58,(forward_list<bool,_std::allocator<bool>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<bool> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x195,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_88,(forward_list<bool,_std::allocator<bool>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<bool,std::allocator<bool>>,std::forward_list<bool,std::allocator<bool>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<bool> >()",
             "std::forward_list<bool> {}",(forward_list<bool,_std::allocator<bool>_> *)local_88,
             (forward_list<bool,_std::allocator<bool>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x195,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)&local_58,(forward_list<signed_char,_std::allocator<signed_char>_> *)local_78
            );
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<signed char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x196,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_88,(forward_list<signed_char,_std::allocator<signed_char>_> *)&local_58
            );
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<signed_char,std::allocator<signed_char>>,std::forward_list<signed_char,std::allocator<signed_char>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<signed char> >()",
             "std::forward_list<signed char> {}",
             (forward_list<signed_char,_std::allocator<signed_char>_> *)local_88,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x196,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::
  object<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)&local_58,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<unsigned char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x197,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_88,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<unsigned_char,std::allocator<unsigned_char>>,std::forward_list<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<unsigned char> >()",
             "std::forward_list<unsigned char> {}",
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x197,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)&local_58,(forward_list<short,_std::allocator<short>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<short> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x198,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_88,(forward_list<short,_std::allocator<short>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<short,std::allocator<short>>,std::forward_list<short,std::allocator<short>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<short> >()",
             "std::forward_list<short> {}",(forward_list<short,_std::allocator<short>_> *)local_88,
             (forward_list<short,_std::allocator<short>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x198,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)&local_58,(forward_list<int,_std::allocator<int>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"test_object__ .has< std::forward_list<int> >()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x199,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_88,(forward_list<int,_std::allocator<int>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<int,std::allocator<int>>,std::forward_list<int,std::allocator<int>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<int> >()",
             "std::forward_list<int> {}",(forward_list<int,_std::allocator<int>_> *)local_88,
             (forward_list<int,_std::allocator<int>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x199,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)&local_58,(forward_list<long,_std::allocator<long>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19a,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_88,(forward_list<long,_std::allocator<long>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long,std::allocator<long>>,std::forward_list<long,std::allocator<long>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<long> >()",
             "std::forward_list<long> {}",(forward_list<long,_std::allocator<long>_> *)local_88,
             (forward_list<long,_std::allocator<long>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)&local_58,(forward_list<long_long,_std::allocator<long_long>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<long long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19b,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_88,(forward_list<long_long,_std::allocator<long_long>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long_long,std::allocator<long_long>>,std::forward_list<long_long,std::allocator<long_long>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<long long> >()",
             "std::forward_list<long long> {}",
             (forward_list<long_long,_std::allocator<long_long>_> *)local_88,
             (forward_list<long_long,_std::allocator<long_long>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)&local_58,(forward_list<long,_std::allocator<long>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<intmax_t> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19c,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_88,(forward_list<long,_std::allocator<long>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long,std::allocator<long>>,std::forward_list<long,std::allocator<long>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<intmax_t> >()",
             "std::forward_list<intmax_t> {}",(forward_list<long,_std::allocator<long>_> *)local_88,
             (forward_list<long,_std::allocator<long>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)&local_58,(forward_list<float,_std::allocator<float>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<float> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19d,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_88,(forward_list<float,_std::allocator<float>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<float,std::allocator<float>>,std::forward_list<float,std::allocator<float>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<float> >()",
             "std::forward_list<float> {}",(forward_list<float,_std::allocator<float>_> *)local_88,
             (forward_list<float,_std::allocator<float>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)&local_58,(forward_list<double,_std::allocator<double>_> *)local_78);
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19e,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_88,(forward_list<double,_std::allocator<double>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<double,std::allocator<double>>,std::forward_list<double,std::allocator<double>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<double> >()",
             "std::forward_list<double> {}",
             (forward_list<double,_std::allocator<double>_> *)local_88,
             (forward_list<double,_std::allocator<double>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x10);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x10);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x10);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::object<std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)&local_58,(forward_list<long_double,_std::allocator<long_double>_> *)local_78
            );
  _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)local_78._0_8_;
  while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    _Var1._M_next = *_Var4._M_head._M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x20);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var1._M_next;
  }
  local_88._1_7_ = (undefined7)((ulong)local_88._0_8_ >> 8);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<long double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19f,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_88,(forward_list<long_double,_std::allocator<long_double>_> *)&local_58
            );
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long_double,std::allocator<long_double>>,std::forward_list<long_double,std::allocator<long_double>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<long double> >()",
             "std::forward_list<long double> {}",
             (forward_list<long_double,_std::allocator<long_double>_> *)local_88,
             (forward_list<long_double,_std::allocator<long_double>_> *)&local_90);
  _Var4._M_head._M_next = local_90._M_head._M_next;
  while (_Var5._M_storage = (void *)local_88._0_8_,
        _Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
    operator_delete((void *)_Var4._M_head._M_next,0x20);
    _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  while ((undefined8 *)_Var5._M_storage != (undefined8 *)0x0) {
    puVar3 = *_Var5._M_storage;
    operator_delete(_Var5._M_storage,0x20);
    _Var5._M_storage = puVar3;
  }
  local_88._0_8_ = (void *)0x0;
  _Var1 = local_98._M_head._M_next;
  while (_Var1._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var1._M_next)->_M_next;
    operator_delete(_Var1._M_next,0x20);
    _Var1._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::
  object<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)&local_58,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_78);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)local_78);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<std::u8string> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a0,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_88,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<std::u8string> >()",
             "std::forward_list<std::u8string> {}",
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_88,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_90);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_90);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)local_88);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_98);
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  jessilib::object::
  object<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)&local_58,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_78);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_78);
  local_88[0] = local_58._M_index == '\x06';
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_index != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "test_object__ .has< std::forward_list<object> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a1,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((_Fwd_list_node_base *)local_78._0_8_ != (_Fwd_list_node_base *)local_68) {
      operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_88,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_58);
  local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<jessilib::object,std::allocator<jessilib::object>>,std::forward_list<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_78,"test_object__.get< std::forward_list<object> >()",
             "std::forward_list<object> {}",
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_88,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_90);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_90);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_88);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_88._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_forward_list) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<object>);
}